

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

trie trie_create_reserve(size_t capacity,size_t key_limit,size_t depth_limit,trie_cb_hash hash_cb,
                        trie_cb_compare compare_cb)

{
  trie __ptr;
  trie_node ptVar1;
  trie_node ptVar2;
  size_t sVar3;
  char *message;
  bool bVar4;
  
  if (hash_cb == (trie_cb_hash)0x0 && compare_cb == (trie_cb_compare)0x0) {
    message = "Trie invalid callback";
    sVar3 = 0x96;
  }
  else {
    __ptr = (trie)malloc(0x48);
    if (__ptr != (trie)0x0) {
      __ptr->size = 1;
      sVar3 = 0x10;
      if (0x10 < capacity) {
        sVar3 = capacity;
      }
      __ptr->capacity = sVar3;
      __ptr->key_limit = key_limit;
      __ptr->depth_limit = depth_limit;
      __ptr->hash_cb = hash_cb;
      __ptr->compare_cb = compare_cb;
      ptVar1 = (trie_node)malloc(sVar3 * 0x28);
      __ptr->node_list = ptVar1;
      ptVar2 = ptVar1;
      if (ptVar1 != (trie_node)0x0) {
        while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
          ptVar2->key = (trie_key)0x0;
          ptVar2->value = (trie_value)0x0;
          ptVar2->parent_index = 0;
          ptVar2->self_index = 0;
          ptVar2->childs = (set)0x0;
          ptVar2 = ptVar2 + 1;
        }
        __ptr->root = ptVar1;
        __ptr->free_node_list = (trie_node_free_conflict)0x0;
        return __ptr;
      }
      log_write_impl_va("metacall",0xaf,"trie_create_reserve",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                        ,LOG_LEVEL_ERROR,"Trie bad node list creation");
      free(__ptr);
      return (trie)0x0;
    }
    message = "Trie bad allocation";
    sVar3 = 0x9f;
  }
  log_write_impl_va("metacall",sVar3,"trie_create_reserve",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                    ,LOG_LEVEL_ERROR,message);
  return (trie)0x0;
}

Assistant:

trie trie_create_reserve(size_t capacity, size_t key_limit, size_t depth_limit, trie_cb_hash hash_cb, trie_cb_compare compare_cb)
{
	trie t;

	size_t iterator;

	if (hash_cb == NULL && compare_cb == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid callback");

		return NULL;
	}

	t = malloc(sizeof(struct trie_type));

	if (t == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie bad allocation");

		return NULL;
	}

	t->size = 1;
	t->capacity = (capacity < TRIE_CAPACITY_MIN) ? TRIE_CAPACITY_MIN : capacity;
	t->key_limit = key_limit;
	t->depth_limit = depth_limit;
	t->hash_cb = hash_cb;
	t->compare_cb = compare_cb;

	t->node_list = malloc(t->capacity * sizeof(struct trie_node_type));

	if (t->node_list == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie bad node list creation");

		free(t);

		return NULL;
	}

	for (iterator = 0; iterator < t->capacity; ++iterator)
	{
		trie_node n = &t->node_list[iterator];

		n->parent_index = 0;
		n->self_index = 0;
		n->key = NULL;
		n->value = NULL;
		n->childs = NULL;
	}

	t->root = &t->node_list[0];

	t->free_node_list = NULL;

	return t;
}